

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IIR2xResampler.cpp
# Opt level: O1

void __thiscall
SRCTools::IIR2xInterpolator::process
          (IIR2xInterpolator *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  IIRSection *pIVar6;
  FloatSample *pFVar7;
  long lVar8;
  SectionBuffer *paBVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  
  uVar3 = *outLength;
  if (uVar3 != 0) {
    uVar4 = *inLength;
    while (uVar4 != 0) {
      paBVar9 = (this->super_IIRResampler).constants.buffer;
      uVar4 = this->phase;
      uVar5 = (this->super_IIRResampler).constants.sectionsCount;
      lVar10 = 0;
      do {
        fVar1 = (*inSamples)[lVar10];
        fVar13 = 0.0;
        if (uVar4 != 0) {
          fVar13 = (this->super_IIRResampler).constants.fir * fVar1;
        }
        if (uVar5 != 0) {
          fVar2 = this->lastInputSamples[lVar10];
          pIVar6 = (this->super_IIRResampler).constants.sections;
          lVar8 = 0;
          do {
            lVar11 = lVar8;
            fVar14 = *(float *)((long)*paBVar9 + lVar11 + 4);
            if (uVar4 == 0) {
              fVar14 = ((*(float *)((long)&pIVar6->num1 + lVar11 * 2) * fVar2 + 1e-20) -
                       *(float *)((long)&pIVar6->den1 + lVar11 * 2) *
                       *(float *)((long)*paBVar9 + lVar11)) -
                       fVar14 * *(float *)((long)&pIVar6->den2 + lVar11 * 2);
              *(float *)((long)*paBVar9 + lVar11 + 4) = fVar14;
            }
            else {
              fVar14 = ((*(float *)((long)&pIVar6->num2 + lVar11 * 2) * fVar2 + 1e-20) -
                       fVar14 * *(float *)((long)&pIVar6->den1 + lVar11 * 2)) -
                       *(float *)((long)&pIVar6->den2 + lVar11 * 2) *
                       *(float *)((long)*paBVar9 + lVar11);
              *(float *)((long)*paBVar9 + lVar11) = fVar14;
            }
            fVar13 = fVar13 + fVar14;
            lVar8 = lVar11 + 8;
          } while ((ulong)uVar5 << 3 != lVar11 + 8);
          paBVar9 = (SectionBuffer *)((long)paBVar9[1] + lVar11);
        }
        pFVar7 = *outSamples;
        *outSamples = pFVar7 + 1;
        *pFVar7 = fVar13 + fVar13;
        if (uVar4 != 0) {
          this->lastInputSamples[lVar10] = fVar1;
        }
        bVar12 = lVar10 == 0;
        lVar10 = lVar10 + 1;
      } while (bVar12);
      *outLength = uVar3 - 1;
      bVar12 = this->phase == 0;
      if (!bVar12) {
        *inSamples = *inSamples + 2;
        *inLength = *inLength - 1;
      }
      this->phase = (uint)bVar12;
      uVar3 = *outLength;
      if (uVar3 == 0) {
        return;
      }
      uVar4 = *inLength;
    }
  }
  return;
}

Assistant:

void IIR2xInterpolator::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	static const IIRCoefficient INTERPOLATOR_AMP = 2.0;

	while (outLength > 0 && inLength > 0) {
		SectionBuffer *bufferp = constants.buffer;
		for (unsigned int chIx = 0; chIx < IIR_RESAMPER_CHANNEL_COUNT; ++chIx) {
			const FloatSample lastInputSample = lastInputSamples[chIx];
			const FloatSample inSample = inSamples[chIx];
			BufferedSample tmpOut = phase == 0 ? 0 : inSample * constants.fir;
			for (unsigned int i = 0; i < constants.sectionsCount; ++i) {
				const IIRSection &section = constants.sections[i];
				SectionBuffer &buffer = *bufferp;
				// For 2x interpolation, calculation of the numerator reduces to a single multiplication depending on the phase.
				if (phase == 0) {
					const BufferedSample numOutSample = section.num1 * lastInputSample;
					const BufferedSample denOutSample = calcDenominator(section, BIAS + numOutSample, buffer[0], buffer[1]);
					buffer[1] = denOutSample;
					tmpOut += denOutSample;
				} else {
					const BufferedSample numOutSample = section.num2 * lastInputSample;
					const BufferedSample denOutSample = calcDenominator(section, BIAS + numOutSample, buffer[1], buffer[0]);
					buffer[0] = denOutSample;
					tmpOut += denOutSample;
				}
				bufferp++;
			}
			*(outSamples++) = FloatSample(INTERPOLATOR_AMP * tmpOut);
			if (phase > 0) {
				lastInputSamples[chIx] = inSample;
			}
		}
		outLength--;
		if (phase > 0) {
			inSamples += IIR_RESAMPER_CHANNEL_COUNT;
			inLength--;
			phase = 0;
		} else {
			phase = 1;
		}
	}
}